

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
    abort_example("Could not init Allegro.\n");
  }
  else {
    if (argc < 2) {
      for (uVar3 = 1; uVar3 != 0x34; uVar3 = uVar3 + 1) {
        log_printf("# t%d\n\n",uVar3 & 0xffffffff);
        (*all_tests[uVar3])();
        log_printf("\n");
      }
    }
    else {
      uVar2 = atoi(argv[1]);
      if (uVar2 - 1 < 0x33) {
        (*all_tests[uVar2])();
      }
    }
    log_printf("Done\n");
    if (error == 0) {
      return 0;
    }
  }
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
   int i;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   open_log_monospace();

   if (argc < 2) {
      for (i = 1; i < NUM_TESTS; i++) {
         log_printf("# t%d\n\n", i);
         all_tests[i]();
         log_printf("\n");
      }
   }
   else {
      i = atoi(argv[1]);
      if (i > 0 && i < NUM_TESTS) {
         all_tests[i]();
      }
   }
   log_printf("Done\n");

   close_log(true);

   if (error) {
      exit(EXIT_FAILURE);
   }

   return 0;
}